

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool llvm::sys::path::has_root_name(Twine *path,Style style)

{
  uint *puVar1;
  StringRef SVar2;
  undefined1 local_a8 [8];
  SmallString<128U> path_storage;
  
  puVar1 = &path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
  path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  local_a8 = (undefined1  [8])puVar1;
  SVar2 = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_a8);
  SVar2 = root_name(SVar2,style);
  if (local_a8 != (undefined1  [8])puVar1) {
    free((void *)local_a8);
  }
  return SVar2.Length != 0;
}

Assistant:

bool has_root_name(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !root_name(p, style).empty();
}